

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_compiler_install_compiler_options(spvc_compiler compiler,spvc_compiler_options options)

{
  char *pcVar1;
  spvc_backend sVar2;
  Compiler *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  sVar2 = compiler->backend;
  if (sVar2 == SPVC_BACKEND_MSL) {
    pCVar3 = (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    *(FragmentOptions *)((long)&pCVar3[2].ir.declared_capabilities + 0x34) =
         (options->glsl).fragment;
    uVar4 = *(undefined8 *)&options->glsl;
    uVar5 = *(undefined8 *)&(options->glsl).force_recompile_max_debug_iterations;
    bVar7 = (options->glsl).emit_uniform_buffer_as_plain_uniforms;
    bVar8 = (options->glsl).emit_line_directives;
    bVar9 = (options->glsl).enable_storage_image_qualifier_deduction;
    bVar10 = (options->glsl).force_zero_initialized_variables;
    bVar11 = (options->glsl).force_flattened_io_blocks;
    bVar12 = (options->glsl).relax_nan_checks;
    bVar13 = (options->glsl).enable_row_major_load_workaround;
    uVar6 = *(undefined8 *)&(options->glsl).ovr_multiview_view_count;
    pcVar1 = (char *)((long)&pCVar3[2].ir.declared_capabilities + 0x24);
    pcVar1[0] = (options->glsl).emit_push_constant_as_uniform_buffer;
    pcVar1[1] = bVar7;
    pcVar1[2] = bVar8;
    pcVar1[3] = bVar9;
    pcVar1[4] = bVar10;
    pcVar1[5] = bVar11;
    pcVar1[6] = bVar12;
    pcVar1[7] = bVar13;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x2c) = uVar6;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x14) = uVar4;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x1c) = uVar5;
    memcpy((void *)((long)(compiler->compiler)._M_t.
                          super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                          .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl[3].ir.
                          ids_for_type + 0xe4),&options->msl,0x8a);
  }
  else if (sVar2 == SPVC_BACKEND_HLSL) {
    pCVar3 = (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    *(FragmentOptions *)((long)&pCVar3[2].ir.declared_capabilities + 0x34) =
         (options->glsl).fragment;
    uVar4 = *(undefined8 *)&options->glsl;
    uVar5 = *(undefined8 *)&(options->glsl).force_recompile_max_debug_iterations;
    bVar7 = (options->glsl).emit_uniform_buffer_as_plain_uniforms;
    bVar8 = (options->glsl).emit_line_directives;
    bVar9 = (options->glsl).enable_storage_image_qualifier_deduction;
    bVar10 = (options->glsl).force_zero_initialized_variables;
    bVar11 = (options->glsl).force_flattened_io_blocks;
    bVar12 = (options->glsl).relax_nan_checks;
    bVar13 = (options->glsl).enable_row_major_load_workaround;
    uVar6 = *(undefined8 *)&(options->glsl).ovr_multiview_view_count;
    pcVar1 = (char *)((long)&pCVar3[2].ir.declared_capabilities + 0x24);
    pcVar1[0] = (options->glsl).emit_push_constant_as_uniform_buffer;
    pcVar1[1] = bVar7;
    pcVar1[2] = bVar8;
    pcVar1[3] = bVar9;
    pcVar1[4] = bVar10;
    pcVar1[5] = bVar11;
    pcVar1[6] = bVar12;
    pcVar1[7] = bVar13;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x2c) = uVar6;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x14) = uVar4;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x1c) = uVar5;
    pCVar3 = (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    uVar4 = *(undefined8 *)&options->hlsl;
    bVar7 = (options->hlsl).support_nonzero_base_vertex_base_instance;
    bVar8 = (options->hlsl).force_storage_buffer_as_uav;
    bVar9 = (options->hlsl).nonwritable_uav_texture_as_srv;
    bVar10 = (options->hlsl).enable_16bit_types;
    bVar11 = (options->hlsl).flatten_matrix_vertex_input_semantics;
    bVar12 = (options->hlsl).use_entry_point_name;
    bVar13 = (options->hlsl).preserve_structured_buffers;
    pcVar1 = (char *)((long)pCVar3[3].ir.ids_for_type + 0x2d);
    pcVar1[0] = (options->hlsl).point_coord_compat;
    pcVar1[1] = bVar7;
    pcVar1[2] = bVar8;
    pcVar1[3] = bVar9;
    pcVar1[4] = bVar10;
    pcVar1[5] = bVar11;
    pcVar1[6] = bVar12;
    pcVar1[7] = bVar13;
    *(undefined8 *)((long)pCVar3[3].ir.ids_for_type + 0x28) = uVar4;
  }
  else if (sVar2 == SPVC_BACKEND_GLSL) {
    pCVar3 = (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    *(FragmentOptions *)((long)&pCVar3[2].ir.declared_capabilities + 0x34) =
         (options->glsl).fragment;
    uVar4 = *(undefined8 *)&options->glsl;
    uVar5 = *(undefined8 *)&(options->glsl).force_recompile_max_debug_iterations;
    bVar7 = (options->glsl).emit_uniform_buffer_as_plain_uniforms;
    bVar8 = (options->glsl).emit_line_directives;
    bVar9 = (options->glsl).enable_storage_image_qualifier_deduction;
    bVar10 = (options->glsl).force_zero_initialized_variables;
    bVar11 = (options->glsl).force_flattened_io_blocks;
    bVar12 = (options->glsl).relax_nan_checks;
    bVar13 = (options->glsl).enable_row_major_load_workaround;
    uVar6 = *(undefined8 *)&(options->glsl).ovr_multiview_view_count;
    pcVar1 = (char *)((long)&pCVar3[2].ir.declared_capabilities + 0x24);
    pcVar1[0] = (options->glsl).emit_push_constant_as_uniform_buffer;
    pcVar1[1] = bVar7;
    pcVar1[2] = bVar8;
    pcVar1[3] = bVar9;
    pcVar1[4] = bVar10;
    pcVar1[5] = bVar11;
    pcVar1[6] = bVar12;
    pcVar1[7] = bVar13;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x2c) = uVar6;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x14) = uVar4;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x1c) = uVar5;
  }
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_install_compiler_options(spvc_compiler compiler, spvc_compiler_options options)
{
	(void)options;
	switch (compiler->backend)
	{
#if SPIRV_CROSS_C_API_GLSL
	case SPVC_BACKEND_GLSL:
		static_cast<CompilerGLSL &>(*compiler->compiler).set_common_options(options->glsl);
		break;
#endif

#if SPIRV_CROSS_C_API_HLSL
	case SPVC_BACKEND_HLSL:
		static_cast<CompilerHLSL &>(*compiler->compiler).set_common_options(options->glsl);
		static_cast<CompilerHLSL &>(*compiler->compiler).set_hlsl_options(options->hlsl);
		break;
#endif

#if SPIRV_CROSS_C_API_MSL
	case SPVC_BACKEND_MSL:
		static_cast<CompilerMSL &>(*compiler->compiler).set_common_options(options->glsl);
		static_cast<CompilerMSL &>(*compiler->compiler).set_msl_options(options->msl);
		break;
#endif

	default:
		break;
	}

	return SPVC_SUCCESS;
}